

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

int __thiscall PFData::writeFile(PFData *this,string *filename)

{
  int iVar1;
  vector<long,_std::allocator<long>_> _offsets;
  allocator_type local_49;
  _Vector_base<long,_std::allocator<long>_> local_48;
  string local_30;
  
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_48,
             (long)this->m_r * (long)this->m_q * (long)this->m_p + 1,&local_49);
  std::__cxx11::string::string((string *)&local_30,(string *)filename);
  iVar1 = writeFile(this,&local_30,(vector<long,_std::allocator<long>_> *)&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  return iVar1;
}

Assistant:

int PFData::writeFile(const std::string filename) {
    std::vector<long> _offsets((m_p*m_q*m_r) + 1);
    return writeFile(filename, _offsets);
}